

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O0

bool __thiscall Assimp::X3DImporter::PostprocessHelper_ElementIsMesh(X3DImporter *this,EType pType)

{
  EType pType_local;
  X3DImporter *this_local;
  
  if ((((((pType == ENET_Arc2D) || (pType == ENET_ArcClose2D)) || (pType == ENET_Box)) ||
       (((pType == ENET_Circle2D || (pType == ENET_Cone)) ||
        ((pType == ENET_Cylinder || ((pType == ENET_Disk2D || (pType == ENET_ElevationGrid))))))))
      || (((pType == ENET_Extrusion ||
           ((((((pType == ENET_IndexedFaceSet || (pType == ENET_IndexedLineSet)) ||
               (pType == ENET_IndexedTriangleFanSet)) ||
              ((pType == ENET_IndexedTriangleSet || (pType == ENET_IndexedTriangleStripSet)))) ||
             ((pType == ENET_PointSet || ((pType == ENET_LineSet || (pType == ENET_Polyline2D))))))
            || (pType == ENET_Polypoint2D)))) ||
          (((pType == ENET_Rectangle2D || (pType == ENET_Sphere)) || (pType == ENET_TriangleFanSet))
          )))) ||
     (((pType == ENET_TriangleSet || (pType == ENET_TriangleSet2D)) ||
      (pType == ENET_TriangleStripSet)))) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool X3DImporter::PostprocessHelper_ElementIsMesh(const CX3DImporter_NodeElement::EType pType) const
{
	if((pType == CX3DImporter_NodeElement::ENET_Arc2D) || (pType == CX3DImporter_NodeElement::ENET_ArcClose2D) ||
		(pType == CX3DImporter_NodeElement::ENET_Box) || (pType == CX3DImporter_NodeElement::ENET_Circle2D) ||
		(pType == CX3DImporter_NodeElement::ENET_Cone) || (pType == CX3DImporter_NodeElement::ENET_Cylinder) ||
		(pType == CX3DImporter_NodeElement::ENET_Disk2D) || (pType == CX3DImporter_NodeElement::ENET_ElevationGrid) ||
		(pType == CX3DImporter_NodeElement::ENET_Extrusion) || (pType == CX3DImporter_NodeElement::ENET_IndexedFaceSet) ||
		(pType == CX3DImporter_NodeElement::ENET_IndexedLineSet) || (pType == CX3DImporter_NodeElement::ENET_IndexedTriangleFanSet) ||
		(pType == CX3DImporter_NodeElement::ENET_IndexedTriangleSet) || (pType == CX3DImporter_NodeElement::ENET_IndexedTriangleStripSet) ||
		(pType == CX3DImporter_NodeElement::ENET_PointSet) || (pType == CX3DImporter_NodeElement::ENET_LineSet) ||
		(pType == CX3DImporter_NodeElement::ENET_Polyline2D) || (pType == CX3DImporter_NodeElement::ENET_Polypoint2D) ||
		(pType == CX3DImporter_NodeElement::ENET_Rectangle2D) || (pType == CX3DImporter_NodeElement::ENET_Sphere) ||
		(pType == CX3DImporter_NodeElement::ENET_TriangleFanSet) || (pType == CX3DImporter_NodeElement::ENET_TriangleSet) ||
		(pType == CX3DImporter_NodeElement::ENET_TriangleSet2D) || (pType == CX3DImporter_NodeElement::ENET_TriangleStripSet))
	{
		return true;
	}
	else
	{
		return false;
	}
}